

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O3

string * __thiscall
lf::io::GmshReader::PhysicalEntityNr2Name_abi_cxx11_
          (string *__return_storage_ptr__,GmshReader *this,size_type number,dim_t codim)

{
  dim_t dVar1;
  size_type sVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr *pp_Var5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pcVar9;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Var10;
  _Base_ptr p_Var11;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  pVar12;
  pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  result;
  size_type local_164;
  string local_160;
  string local_140;
  pointer local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  pointer local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  pointer local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [8];
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8 [56];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_164 = number;
  pVar12 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
           ::equal_range(&(this->nr_2_name_)._M_t,&local_164);
  _Var10 = pVar12.second._M_node;
  _Var3 = pVar12.first._M_node;
  if (_Var3._M_node == _Var10._M_node) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_160,local_164);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "Physical entity with number ",&local_160);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c0," not found.");
    local_e0 = (pointer)&local_d0;
    pcVar9 = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar9 == paVar8) {
      local_d0 = paVar8->_M_allocated_capacity;
      uStack_c8 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
      uStack_c4 = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
      pcVar9 = local_e0;
    }
    else {
      local_d0 = paVar8->_M_allocated_capacity;
    }
    sVar2 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    *puVar6 = &PTR__LfException_004d4a40;
    puVar6[1] = puVar6 + 3;
    if (pcVar9 == local_e0) {
      *(undefined4 *)(puVar6 + 3) = (undefined4)local_d0;
      *(undefined4 *)((long)puVar6 + 0x1c) = local_d0._4_4_;
      *(undefined4 *)(puVar6 + 4) = uStack_c8;
      *(undefined4 *)((long)puVar6 + 0x24) = uStack_c4;
    }
    else {
      puVar6[1] = pcVar9;
      puVar6[3] = local_d0;
    }
    puVar6[2] = sVar2;
    local_d8 = 0;
    local_d0 = local_d0 & 0xffffffffffffff00;
    __cxa_throw(puVar6,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  local_c0._0_4_ = _Var3._M_node[1]._M_color;
  local_b8 = (_Base_ptr)local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,_Var3._M_node[1]._M_parent,
             (long)&(_Var3._M_node[1]._M_parent)->_M_color +
             (long)&(_Var3._M_node[1]._M_left)->_M_color);
  dVar1 = *(dim_t *)&_Var3._M_node[2]._M_parent;
  local_a8._16_4_ = dVar1;
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(_Var3._M_node);
  if (p_Var4 == _Var10._M_node) {
    if ((codim != 0xffffffff) && (dVar1 != codim)) {
LAB_001b85d4:
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string((string *)(local_a8 + 0x18),local_164);
      std::operator+(&local_50,"Physical entity with number=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a8 + 0x18));
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50,", codim=");
      local_140._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p == paVar8) {
        local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_140._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string(&local_70,codim);
      std::operator+(&local_160,&local_140,&local_70);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_160," not found.");
      local_120 = (pointer)&local_110;
      pcVar9 = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 == paVar8) {
        local_110 = paVar8->_M_allocated_capacity;
        uStack_108 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
        uStack_104 = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
        pcVar9 = local_120;
      }
      else {
        local_110 = paVar8->_M_allocated_capacity;
      }
      sVar2 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      *puVar6 = &PTR__LfException_004d4a40;
      puVar6[1] = puVar6 + 3;
      if (pcVar9 == local_120) {
        *(undefined4 *)(puVar6 + 3) = (undefined4)local_110;
        *(undefined4 *)((long)puVar6 + 0x1c) = local_110._4_4_;
        *(undefined4 *)(puVar6 + 4) = uStack_108;
        *(undefined4 *)((long)puVar6 + 0x24) = uStack_104;
      }
      else {
        puVar6[1] = pcVar9;
        puVar6[3] = local_110;
      }
      puVar6[2] = sVar2;
      local_118 = 0;
      local_110 = local_110 & 0xffffffffffffff00;
      __cxa_throw(puVar6,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
  }
  else {
    if (codim == 0xffffffff) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_140,local_164);
      std::operator+(&local_160,"There are multiple physical entities with the Number ",&local_140);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_160,", please specify also the codimension");
      local_100 = (pointer)&local_f0;
      pcVar9 = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 == paVar8) {
        local_f0 = paVar8->_M_allocated_capacity;
        uStack_e8 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
        uStack_e4 = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
        pcVar9 = local_100;
      }
      else {
        local_f0 = paVar8->_M_allocated_capacity;
      }
      sVar2 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      *puVar6 = &PTR__LfException_004d4a40;
      puVar6[1] = puVar6 + 3;
      if (pcVar9 == local_100) {
        *(undefined4 *)(puVar6 + 3) = (undefined4)local_f0;
        *(undefined4 *)((long)puVar6 + 0x1c) = local_f0._4_4_;
        *(undefined4 *)(puVar6 + 4) = uStack_e8;
        *(undefined4 *)((long)puVar6 + 0x24) = uStack_e4;
      }
      else {
        puVar6[1] = pcVar9;
        puVar6[3] = local_f0;
      }
      puVar6[2] = sVar2;
      local_f8 = 0;
      local_f0 = local_f0 & 0xffffffffffffff00;
      __cxa_throw(puVar6,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
    if (dVar1 != codim) {
      for (; *(dim_t *)&p_Var4[2]._M_parent != codim;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        if (p_Var4 == _Var10._M_node) goto LAB_001b85d4;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pp_Var5 = &p_Var4[1]._M_left;
      p_Var11 = p_Var4[1]._M_parent;
      goto LAB_001b8594;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pp_Var5 = &local_b0;
  p_Var11 = local_b8;
LAB_001b8594:
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,p_Var11,
             (long)&p_Var11->_M_color + (long)&(*pp_Var5)->_M_color);
  if (local_b8 != (_Base_ptr)local_a8) {
    operator_delete(local_b8,local_a8._0_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GmshReader::PhysicalEntityNr2Name(size_type number,
                                              dim_t codim) const {
  auto [begin, end] = nr_2_name_.equal_range(number);  // NOLINT
  if (begin == end) {
    throw base::LfException("Physical entity with number " +
                            std::to_string(number) + " not found.");
  }
  auto result = *begin;
  ++begin;
  if (begin == end) {
    if (codim == static_cast<dim_t>(-1) || result.second.second == codim) {
      return result.second.first;
    }
  } else {
    if (codim == static_cast<dim_t>(-1)) {
      throw base::LfException(
          "There are multiple physical entities with the Number " +
          std::to_string(number) + ", please specify also the codimension");
    }
    if (result.second.second == codim) {
      return result.second.first;
    }
    while (begin->second.second != codim && begin != end) {
      ++begin;
    }
    if (begin->second.second == codim) {
      return begin->second.first;
    }
  }
  throw base::LfException(
      "Physical entity with number=" + std::to_string(number) +
      ", codim=" + std::to_string(codim) + " not found.");
}